

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O1

void __thiscall CTcDataStream::append_stream(CTcDataStream *this,CTcDataStream *stream)

{
  ulong uVar1;
  CTcStreamAnchor *pCVar2;
  CTcStreamAnchor *pCVar3;
  void *pvVar4;
  CTcStreamAnchor *pCVar5;
  void *__buf;
  ulong uVar6;
  
  uVar1 = this->ofs_;
  pvVar4 = (void *)stream->ofs_;
  if (pvVar4 != (void *)0x0) {
    uVar6 = 0;
    do {
      __buf = (void *)(65000 - uVar6 % 65000);
      if (pvVar4 < __buf) {
        __buf = pvVar4;
      }
      write(this,(int)(uVar6 % 65000) + (int)stream->pages_[uVar6 / 65000],__buf,0x20438d7022c8d47d)
      ;
      uVar6 = uVar6 + (long)__buf;
      pvVar4 = (void *)((long)pvVar4 - (long)__buf);
    } while (pvVar4 != (void *)0x0);
  }
  if (stream->first_anchor_ != (CTcStreamAnchor *)0x0) {
    pCVar3 = stream->first_anchor_;
    do {
      pCVar2 = pCVar3->nxt_;
      pCVar3->ofs_ = pCVar3->ofs_ + uVar1;
      pCVar3->nxt_ = (CTcStreamAnchor *)0x0;
      pCVar5 = this->last_anchor_;
      if (this->last_anchor_ == (CTcStreamAnchor *)0x0) {
        pCVar5 = (CTcStreamAnchor *)&this->first_anchor_;
      }
      pCVar5->nxt_ = pCVar3;
      this->last_anchor_ = pCVar3;
      pCVar3 = pCVar2;
    } while (pCVar2 != (CTcStreamAnchor *)0x0);
  }
  return;
}

Assistant:

void CTcDataStream::append_stream(CTcDataStream *stream)
{
    ulong rem;
    ulong ofs;
    ulong start_ofs;
    CTcStreamAnchor *anchor;
    CTcStreamAnchor *nxt;

    /* remember the starting offset of the copy in my stream */
    start_ofs = get_ofs();
    
    /* copy all data from the other stream */
    for (ofs = 0, rem = stream->get_ofs() ; rem != 0 ; )
    {
        ulong request;
        const char *ptr;
        ulong actual;

        /* 
         *   request as much as possible from the other stream, up to the
         *   remaining length or 64k, whichever is smaller 
         */
        request = 65535;
        if (rem < request)
            request = rem;

        /* get the chunk from the source stream */
        ptr = stream->get_block_ptr(ofs, request, &actual);

        /* 
         *   write this chunk (which we know is less than 64k and can thus
         *   be safely cast to size_t, even on 16-bit machines) 
         */
        write(ptr, (size_t)actual);

        /* advance our counters */
        rem -= actual;
        ofs += actual;
    }

    /*
     *   Now copy all of the anchors from the source stream to our stream.
     *   This will ensure that fixups in the other stream have
     *   corresponding fixups in this stream.  Note that we must adjust
     *   the offset of each copied anchor by the offset of the start of
     *   the copied data in our stream.  
     */
    for (anchor = stream->get_first_anchor() ; anchor != 0 ; anchor = nxt)
    {
        /* 
         *   remember the old link to the next anchor, since we're going
         *   to move the anchor to my list and thus forget about its
         *   position in the old list 
         */
        nxt = anchor->nxt_;

        /* adjust the anchor's offset */
        anchor->ofs_ += start_ofs;

        /* unlink the anchor from its old stream */
        anchor->nxt_ = 0;

        /* link it in to my anchor list */
        if (last_anchor_ != 0)
            last_anchor_->nxt_ = anchor;
        else
            first_anchor_ = anchor;
        last_anchor_ = anchor;
    }
}